

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

void __thiscall
soul::StructuralParser::parseAnnotation(StructuralParser *this,Annotation *annotation)

{
  pointer pPVar1;
  bool bVar2;
  Property *pPVar3;
  UnqualifiedName *pUVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  value_type local_108;
  Context local_f8;
  Context context;
  string name;
  UnqualifiedName *local_a8;
  Expression *local_a0;
  CompileMessage local_68;
  
  pPVar1 = (annotation->properties).
           super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((annotation->properties).
      super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
      ._M_impl.super__Vector_impl_data._M_finish != pPVar1) {
    (annotation->properties).
    super__Vector_base<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
    ._M_impl.super__Vector_impl_data._M_finish = pPVar1;
  }
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x275da2);
  if (bVar2) {
    bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x275af2);
    if (!bVar2) {
      do {
        getContext(&context,this);
        parseAnnotationKey_abi_cxx11_(&name,this);
        checkLength(this,&name,0x80);
        Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
        ::skip(&this->super_SOULTokeniser);
        pPVar3 = AST::Annotation::findProperty<std::__cxx11::string>(annotation,&name);
        if (pPVar3 != (Property *)0x0) {
          Errors::nameInUse<std::__cxx11::string&>(&local_68,(Errors *)&name,args);
          AST::Context::throwError(&context,&local_68,false);
        }
        local_a8 = (UnqualifiedName *)
                   AST::Allocator::get<std::__cxx11::string>(this->allocator,&name);
        pUVar4 = allocate<soul::AST::UnqualifiedName,soul::AST::Context&,soul::Identifier>
                           (this,&context,(Identifier *)&local_a8);
        bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x275274);
        if (bVar2) {
          local_a8 = pUVar4;
          local_a0 = parseExpression(this,false);
          std::
          vector<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
          ::push_back(&annotation->properties,(value_type *)&local_a8);
        }
        else {
          local_108.name.object = pUVar4;
          getContext(&local_f8,this);
          soul::Value::Value((Value *)&local_a8,true);
          local_108.value.object =
               &allocate<soul::AST::Constant,soul::AST::Context,soul::Value>
                          (this,&local_f8,(Value *)&local_a8)->super_Expression;
          std::
          vector<soul::AST::Annotation::Property,_std::allocator<soul::AST::Annotation::Property>_>
          ::push_back(&annotation->properties,&local_108);
          soul::Value::~Value((Value *)&local_a8);
          RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
                    ((RefCountedPtr<soul::SourceCodeText> *)&local_f8);
        }
        std::__cxx11::string::~string((string *)&name);
        RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
                  ((RefCountedPtr<soul::SourceCodeText> *)&context);
        bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x275d9e);
      } while (bVar2);
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x275af2);
    }
  }
  return;
}

Assistant:

void parseAnnotation (AST::Annotation& annotation)
    {
        annotation.properties.clear();

        if (matchIf (Operator::openDoubleBracket))
        {
            if (matchIf (Operator::closeDoubleBracket))
                return;

            do
            {
                auto context = getContext();
                auto name = parseAnnotationKey();
                checkLength (name, AST::maxIdentifierLength);
                skip();

                if (annotation.findProperty (name) != nullptr)
                    context.throwError (Errors::nameInUse (name));

                auto& key = allocate<AST::UnqualifiedName> (context, allocator.get (name));

                if (matchIf (Operator::colon))
                    annotation.addProperty ({ key, parseExpression() });
                else
                    annotation.addProperty ({ key, allocate<AST::Constant> (getContext(), Value (true)) });
            }
            while (matchIf (Operator::comma));

            expect (Operator::closeDoubleBracket);
        }
    }